

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_xviexpdp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i64 dst_01;
  TCGv_i64 dst_02;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o_5;
  uintptr_t o_3;
  uintptr_t o;
  
  if (ctx->vsx_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    ret = tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    dst = tcg_temp_new_i64(tcg_ctx);
    dst_00 = tcg_temp_new_i64(tcg_ctx);
    dst_01 = tcg_temp_new_i64(tcg_ctx);
    dst_02 = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx,dst,(ctx->opcode >> 0x10 & 0x1f) + (ctx->opcode & 4) * 8);
    get_cpu_vsrl(tcg_ctx,dst_00,(ctx->opcode >> 0x10 & 0x1f) + (ctx->opcode & 4) * 8);
    get_cpu_vsrh(tcg_ctx,dst_01,ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4);
    get_cpu_vsrl(tcg_ctx,dst_02,ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4);
    tcg_gen_deposit_i64_ppc64(tcg_ctx,ret,dst,dst_01,0x34,0xb);
    set_cpu_vsrh(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,ret);
    tcg_gen_deposit_i64_ppc64(tcg_ctx,ret_00,dst_00,dst_02,0x34,0xb);
    set_cpu_vsrl(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,ret_00);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst_00 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst_01 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst_02 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xviexpdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xah;
    TCGv_i64 xal;
    TCGv_i64 xbh;
    TCGv_i64 xbl;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xah = tcg_temp_new_i64(tcg_ctx);
    xal = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xah, xA(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xal, xA(ctx->opcode));
    get_cpu_vsrh(tcg_ctx, xbh, xB(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xbl, xB(ctx->opcode));

    tcg_gen_deposit_i64(tcg_ctx, xth, xah, xbh, 52, 11);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);

    tcg_gen_deposit_i64(tcg_ctx, xtl, xal, xbl, 52, 11);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);

    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xah);
    tcg_temp_free_i64(tcg_ctx, xal);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}